

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void breakstat(LexState *ls,int line)

{
  TString *name;
  BlockCnt *local_20;
  BlockCnt *bl;
  int line_local;
  LexState *ls_local;
  
  local_20 = ls->fs->bl;
  while( true ) {
    if (local_20 == (BlockCnt *)0x0) {
      luaX_syntaxerror(ls,"break outside loop");
    }
    if (local_20->isloop != '\0') break;
    local_20 = local_20->previous;
  }
  local_20->isloop = '\x02';
  luaX_next(ls);
  name = luaS_newlstr(ls->L,"break",5);
  newgotoentry(ls,name,line);
  return;
}

Assistant:

static void breakstat (LexState *ls, int line) {
  BlockCnt *bl;  /* to look for an enclosing loop */
  for (bl = ls->fs->bl; bl != NULL; bl = bl->previous) {
    if (bl->isloop)  /* found one? */
      goto ok;
  }
  luaX_syntaxerror(ls, "break outside loop");
 ok:
  bl->isloop = 2;  /* signal that block has pending breaks */
  luaX_next(ls);  /* skip break */
  newgotoentry(ls, luaS_newliteral(ls->L, "break"), line);
}